

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_new.c
# Opt level: O1

LY_ERR lyd_new_any(lyd_node *parent,lys_module *module,char *name,void *value,
                  LYD_ANYDATA_VALUETYPE value_type,uint32_t options,lyd_node **node)

{
  ly_ctx *plVar1;
  LY_ERR LVar2;
  lys_module *plVar3;
  size_t name_len;
  lysc_node *plVar4;
  char *pcVar5;
  ly_ctx *ctx;
  lyd_node *ret;
  LYD_ANYDATA_VALUETYPE local_4c;
  lysc_ext_instance *ext;
  lysc_node *schema;
  size_t local_38;
  
  ret = (lyd_node *)0x0;
  ext = (lysc_ext_instance *)0x0;
  if (parent == (lyd_node *)0x0) {
    plVar3 = module;
    if (module != (lys_module *)0x0) goto LAB_0012cf48;
    ctx = (ly_ctx *)0x0;
  }
  else {
    if (parent->schema == (lysc_node *)0x0) {
      plVar3 = (lys_module *)&parent[2].schema;
    }
    else {
      plVar3 = parent->schema->module;
    }
LAB_0012cf48:
    ctx = plVar3->ctx;
  }
  if (parent == (lyd_node *)0x0 && module == (lys_module *)0x0) {
    pcVar5 = "parent || module";
  }
  else if (parent == (lyd_node *)0x0 && node == (lyd_node **)0x0) {
    pcVar5 = "parent || node";
  }
  else if (name == (char *)0x0) {
    pcVar5 = "name";
  }
  else {
    if (value != (void *)0x0 || value_type < LYD_ANYDATA_XML) {
      if (parent != (lyd_node *)0x0) {
        plVar4 = parent->schema;
        if (plVar4 == (lysc_node *)0x0) {
          if (module == (lys_module *)0x0) goto LAB_0012d048;
          plVar1 = (ly_ctx *)parent[2].schema;
        }
        else {
          if (module == (lys_module *)0x0) goto LAB_0012d048;
          plVar1 = plVar4->module->ctx;
        }
        if ((plVar1 != (ly_ctx *)0x0) && (module->ctx != (ly_ctx *)0x0)) {
          if (plVar4 == (lysc_node *)0x0) {
            plVar3 = (lys_module *)&parent[2].schema;
          }
          else {
            plVar3 = plVar4->module;
          }
          if (plVar3->ctx != module->ctx) {
            if (plVar4 == (lysc_node *)0x0) {
              plVar3 = (lys_module *)&parent[2].schema;
            }
            else {
              plVar3 = plVar4->module;
            }
            ly_log(plVar3->ctx,LY_LLERR,LY_EINVAL,
                   "Different contexts mixed in a single function call.");
            return LY_EINVAL;
          }
        }
      }
LAB_0012d048:
      if (module == (lys_module *)0x0) {
        module = parent->schema->module;
      }
      if (parent == (lyd_node *)0x0) {
        plVar4 = (lysc_node *)0x0;
      }
      else {
        plVar4 = parent->schema;
      }
      local_4c = value_type;
      schema = lys_find_child(plVar4,module,name,0,0x60,(options & 1) << 4);
      if ((parent != (lyd_node *)0x0) && (schema == (lysc_node *)0x0)) {
        pcVar5 = module->name;
        local_38 = strlen(pcVar5);
        name_len = strlen(name);
        LVar2 = ly_nested_ext_schema
                          (parent,(lysc_node *)0x0,pcVar5,local_38,LY_VALUE_JSON,(void *)0x0,name,
                           name_len,&schema,&ext);
        if ((LVar2 != LY_ENOT) && (LVar2 != LY_SUCCESS)) {
          return LVar2;
        }
      }
      if (schema == (lysc_node *)0x0) {
        ly_log(ctx,LY_LLERR,LY_EINVAL,"Any node \"%s\" not found.",name);
        return LY_ENOTFOUND;
      }
      LVar2 = lyd_create_any(schema,value,local_4c,(byte)(options >> 8) & 1,&ret);
      if (LVar2 != LY_SUCCESS) {
        return LVar2;
      }
      if (ext != (lysc_ext_instance *)0x0) {
        ret->flags = ret->flags | 8;
      }
      if (parent != (lyd_node *)0x0) {
        lyd_insert_node(parent,(lyd_node **)0x0,ret,0);
      }
      if (node == (lyd_node **)0x0) {
        return LY_SUCCESS;
      }
      *node = ret;
      return LY_SUCCESS;
    }
    pcVar5 = "(value_type == LYD_ANYDATA_DATATREE) || (value_type == LYD_ANYDATA_STRING) || value";
  }
  ly_log(ctx,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar5,"lyd_new_any");
  return LY_EINVAL;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_new_any(struct lyd_node *parent, const struct lys_module *module, const char *name, const void *value,
        LYD_ANYDATA_VALUETYPE value_type, uint32_t options, struct lyd_node **node)
{
    LY_ERR r;
    struct lyd_node *ret = NULL;
    const struct lysc_node *schema;
    struct lysc_ext_instance *ext = NULL;
    const struct ly_ctx *ctx = parent ? LYD_CTX(parent) : (module ? module->ctx : NULL);
    uint32_t getnext_opts = (options & LYD_NEW_VAL_OUTPUT) ? LYS_GETNEXT_OUTPUT : 0;
    ly_bool use_value = (options & LYD_NEW_ANY_USE_VALUE) ? 1 : 0;

    LY_CHECK_ARG_RET(ctx, parent || module, parent || node, name,
            (value_type == LYD_ANYDATA_DATATREE) || (value_type == LYD_ANYDATA_STRING) || value, LY_EINVAL);
    LY_CHECK_CTX_EQUAL_RET(parent ? LYD_CTX(parent) : NULL, module ? module->ctx : NULL, LY_EINVAL);

    if (!module) {
        module = parent->schema->module;
    }

    schema = lys_find_child(parent ? parent->schema : NULL, module, name, 0, LYD_NODE_ANY, getnext_opts);
    if (!schema && parent) {
        r = ly_nested_ext_schema(parent, NULL, module->name, strlen(module->name), LY_VALUE_JSON, NULL, name,
                strlen(name), &schema, &ext);
        LY_CHECK_RET(r && (r != LY_ENOT), r);
    }
    LY_CHECK_ERR_RET(!schema, LOGERR(ctx, LY_EINVAL, "Any node \"%s\" not found.", name), LY_ENOTFOUND);

    LY_CHECK_RET(lyd_create_any(schema, value, value_type, use_value, &ret));
    if (ext) {
        ret->flags |= LYD_EXT;
    }
    if (parent) {
        lyd_insert_node(parent, NULL, ret, LYD_INSERT_NODE_DEFAULT);
    }

    if (node) {
        *node = ret;
    }
    return LY_SUCCESS;
}